

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

int Abc_AigCleanup(Abc_Aig_t *pMan)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  int i;
  Abc_Obj_t **ppAVar5;
  
  iVar1 = pMan->nEntries;
  p = Vec_PtrAlloc(100);
  for (lVar4 = 0; lVar4 < pMan->nBins; lVar4 = lVar4 + 1) {
    ppAVar5 = pMan->pBins + lVar4;
    while (pAVar2 = *ppAVar5, pAVar2 != (Abc_Obj_t *)0x0) {
      if ((pAVar2->vFanouts).nSize == 0) {
        Vec_PtrPush(p,pAVar2);
      }
      ppAVar5 = &pAVar2->pNext;
    }
  }
  i = 0;
  iVar3 = p->nSize;
  if (p->nSize < 1) {
    iVar3 = i;
  }
  for (; iVar3 != i; i = i + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
    Abc_AigDeleteNode(pMan,pAVar2);
  }
  Vec_PtrFree(p);
  return iVar1 - pMan->nEntries;
}

Assistant:

int Abc_AigCleanup( Abc_Aig_t * pMan )
{
    Vec_Ptr_t * vDangles;
    Abc_Obj_t * pAnd;
    int i, nNodesOld;
//    printf( "Strash0 = %d.  Strash1 = %d.  Strash100 = %d.  StrashM = %d.\n", 
//        pMan->nStrash0, pMan->nStrash1, pMan->nStrash5, pMan->nStrash2 );
    nNodesOld = pMan->nEntries;
    // collect the AND nodes that do not fanout
    vDangles = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            if ( Abc_ObjFanoutNum(pAnd) == 0 )
                Vec_PtrPush( vDangles, pAnd );
    // process the dangling nodes and their MFFCs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDangles, pAnd, i )
        Abc_AigDeleteNode( pMan, pAnd );
    Vec_PtrFree( vDangles );
    return nNodesOld - pMan->nEntries;
}